

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O1

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_edge
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *s)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_node_base *p_Var3;
  Edge_handle local_40;
  
  p_Var1 = (s->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(s->simplex_set)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    p_Var3 = p_Var1;
    do {
      while (p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1),
            (_Rb_tree_header *)p_Var1 != p_Var2) {
        add_edge(&local_40,this,(Vertex_handle)p_Var3[1]._M_color,(Vertex_handle)p_Var1[1]._M_color)
        ;
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      p_Var3 = p_Var1;
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void add_edge(const Simplex& s) {
    for (auto i = s.begin(); i != s.end(); ++i)
      for (auto j = i; ++j != s.end(); /**/)
        add_edge(*i, *j);
  }